

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

string * __thiscall Character::SourceName_abi_cxx11_(string *__return_storage_ptr__,Character *this)

{
  ulong uVar1;
  string *local_38;
  Character *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_38 = (string *)&this->faux_name;
  }
  else {
    local_38 = (string *)&this->real_name;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Character::SourceName() const
{
	return faux_name.empty() ? real_name : faux_name;
}